

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  vec3f v;
  array<vec<3UL,_int>,_3UL> pts;
  size_t sVar1;
  int j;
  long lVar2;
  size_t i;
  ulong iface;
  double dVar3;
  vec3i vVar4;
  array<vec<3UL,_int>,_3UL> screen_coords;
  vector<double,_std::allocator<double>_> zbuffer;
  array<vec<3UL,_double>,_3UL> world_coords;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_108;
  TGAImage *local_100;
  vec3f local_f8;
  _Vector_base<double,_std::allocator<double>_> local_e0;
  vec<3UL,_double> local_c8;
  vec<3UL,_double> vStack_b0;
  vec<3UL,_double> local_98;
  vec<3UL,_double> local_78;
  vec<3UL,_double> local_60;
  vec3f local_48;
  
  local_c8.x = -1.79769313486232e+308;
  local_100 = image;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_e0,360000,&local_c8.x,
             (allocator_type *)&local_128);
  iface = 0;
  while( true ) {
    sVar1 = Model::nfaces(model);
    if (sVar1 <= iface) break;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_108 = 0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    vStack_b0.y = 0.0;
    vStack_b0.z = 0.0;
    local_98.z = 0.0;
    local_c8.z = 0.0;
    vStack_b0.x = 0.0;
    local_c8.x = 0.0;
    local_c8.y = 0.0;
    lVar2 = 0;
    for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
      Model::vert(&local_48,model,iface,sVar1);
      v.y = local_48.y;
      v.x = local_48.x;
      v.z = local_48.z;
      vVar4 = world2screen(v);
      *(long *)((long)&local_128 + lVar2) = vVar4._0_8_;
      *(int *)((long)&uStack_120 + lVar2) = vVar4.z;
      Model::vert(&local_f8,model,iface,sVar1);
      *(double *)((long)&local_c8.z + lVar2 * 2) = local_f8.z;
      *(double *)((long)&local_c8.x + lVar2 * 2) = local_f8.x;
      *(double *)((long)&local_c8.y + lVar2 * 2) = local_f8.y;
      lVar2 = lVar2 + 0xc;
    }
    operator-(&local_60,&local_98,&local_c8);
    operator-(&local_78,&vStack_b0,&local_c8);
    local_f8.x = local_78.z * local_60.y - local_60.z * local_78.y;
    local_f8.y = local_78.x * local_60.z - local_60.x * local_78.z;
    local_f8.z = local_60.x * local_78.y - local_78.x * local_60.y;
    vec<3UL,_double>::normalize(&local_f8);
    dVar3 = dot<3ul,double>(&local_f8,&light_dir);
    if (0.0 < dVar3) {
      pts._M_elems[0].z = (undefined4)uStack_120;
      pts._M_elems[1].x = uStack_120._4_4_;
      pts._M_elems[0].x = (undefined4)local_128;
      pts._M_elems[0].y = local_128._4_4_;
      pts._M_elems[1].y = (undefined4)local_118;
      pts._M_elems[1].z = local_118._4_4_;
      pts._M_elems[2].x = (undefined4)uStack_110;
      pts._M_elems[2].y = uStack_110._4_4_;
      pts._M_elems[2].z = local_108;
      triangle(pts,(vector<double,_std::allocator<double>_> *)&local_e0,local_100,
               (TGAColor)((uint5)((int)(dVar3 * 255.0) & 0xff) * 0x10101 | 0x4ff000000));
    }
    iface = iface + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e0);
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> screen_coords;
        std::array<vec3f, 3> world_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = world2screen(model.vert(i, j));
            world_coords[j] = model.vert(i, j);
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, zbuffer, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}